

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

bool __thiscall testing::internal::DeathTestImpl::Passed(DeathTestImpl *this,bool status_ok)

{
  bool bVar1;
  DeathTestOutcome DVar2;
  int exit_code;
  Message *pMVar3;
  char *str;
  RE *pRVar4;
  ostream *poVar5;
  String *in_stack_fffffffffffffd50;
  String *in_stack_fffffffffffffd58;
  Message *in_stack_fffffffffffffd60;
  String local_1d0;
  GTestLog local_1bc;
  String local_1b8 [2];
  internal local_198 [32];
  internal local_178 [16];
  String local_168 [2];
  internal local_148 [32];
  char *local_128;
  undefined1 local_119;
  undefined1 local_118 [7];
  bool matched;
  internal local_f8 [32];
  String local_d8 [2];
  internal local_b8 [32];
  String local_98 [2];
  internal local_78 [32];
  char *local_58;
  Message local_40;
  Message buffer;
  undefined1 local_30 [7];
  bool success;
  String error_message;
  bool status_ok_local;
  DeathTestImpl *this_local;
  
  error_message.length_._7_1_ = status_ok;
  bVar1 = spawned(this);
  if (bVar1) {
    GetCapturedStderr();
    buffer.ss_.ptr_._7_1_ = 0;
    Message::Message(in_stack_fffffffffffffd60);
    Message::operator<<(&local_40,(char (*) [13])"Death test: ");
    local_58 = statement(this);
    pMVar3 = Message::operator<<(in_stack_fffffffffffffd60,&in_stack_fffffffffffffd58->c_str_);
    Message::operator<<(pMVar3,(char (*) [2])0x1575f3);
    DVar2 = outcome(this);
    switch(DVar2) {
    case IN_PROGRESS:
    default:
      GTestLog::GTestLog(&local_1bc,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/googletest/src/gtest-death-test.cc"
                         ,0x213);
      poVar5 = GTestLog::GetStream(&local_1bc);
      std::operator<<(poVar5,"DeathTest::Passed somehow called before conclusion of test");
      GTestLog::~GTestLog(&local_1bc);
      break;
    case DIED:
      if ((error_message.length_._7_1_ & 1) == 0) {
        pMVar3 = Message::operator<<(&local_40,
                                     (char (*) [51])
                                     "    Result: died but not with expected exit code:\n");
        Message::operator<<(pMVar3,(char (*) [13])"            ");
        exit_code = status(this);
        ExitSummary(local_178,exit_code);
        pMVar3 = Message::operator<<(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
        in_stack_fffffffffffffd58 = (String *)Message::operator<<(pMVar3,(char (*) [2])0x1575f3);
        in_stack_fffffffffffffd50 =
             (String *)
             Message::operator<<((Message *)in_stack_fffffffffffffd58,(char (*) [13])"Actual msg:\n"
                                );
        String::operator_cast_to_string(local_1b8);
        FormatDeathTestOutput(local_198,(string *)local_1b8);
        Message::operator<<((Message *)in_stack_fffffffffffffd50,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_198);
        std::__cxx11::string::~string((string *)local_198);
        std::__cxx11::string::~string((string *)local_1b8);
        String::~String(in_stack_fffffffffffffd50);
      }
      else {
        str = String::c_str((String *)local_30);
        pRVar4 = regex(this);
        local_119 = RE::PartialMatch(str,pRVar4);
        if ((bool)local_119) {
          buffer.ss_.ptr_._7_1_ = 1;
        }
        else {
          pMVar3 = Message::operator<<(&local_40,
                                       (char (*) [47])
                                       "    Result: died but not with expected error.\n");
          Message::operator<<(pMVar3,(char (*) [13])"  Expected: ");
          pRVar4 = regex(this);
          local_128 = RE::pattern(pRVar4);
          pMVar3 = Message::operator<<(in_stack_fffffffffffffd60,&in_stack_fffffffffffffd58->c_str_)
          ;
          pMVar3 = Message::operator<<(pMVar3,(char (*) [2])0x1575f3);
          pMVar3 = Message::operator<<(pMVar3,(char (*) [13])"Actual msg:\n");
          String::operator_cast_to_string(local_168);
          FormatDeathTestOutput(local_148,(string *)local_168);
          Message::operator<<(pMVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_148);
          std::__cxx11::string::~string((string *)local_148);
          std::__cxx11::string::~string((string *)local_168);
        }
      }
      break;
    case LIVED:
      pMVar3 = Message::operator<<(&local_40,(char (*) [28])"    Result: failed to die.\n");
      pMVar3 = Message::operator<<(pMVar3,(char (*) [13])" Error msg:\n");
      String::operator_cast_to_string(local_98);
      FormatDeathTestOutput(local_78,(string *)local_98);
      Message::operator<<(pMVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_78);
      std::__cxx11::string::~string((string *)local_78);
      std::__cxx11::string::~string((string *)local_98);
      break;
    case RETURNED:
      pMVar3 = Message::operator<<(&local_40,
                                   (char (*) [47])"    Result: illegal return in test statement.\n")
      ;
      pMVar3 = Message::operator<<(pMVar3,(char (*) [13])" Error msg:\n");
      String::operator_cast_to_string((String *)local_118);
      FormatDeathTestOutput(local_f8,(string *)local_118);
      Message::operator<<(pMVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_f8);
      std::__cxx11::string::~string((string *)local_f8);
      std::__cxx11::string::~string((string *)local_118);
      break;
    case THREW:
      pMVar3 = Message::operator<<(&local_40,(char (*) [33])"    Result: threw an exception.\n");
      pMVar3 = Message::operator<<(pMVar3,(char (*) [13])" Error msg:\n");
      String::operator_cast_to_string(local_d8);
      FormatDeathTestOutput(local_b8,(string *)local_d8);
      Message::operator<<(pMVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_b8);
      std::__cxx11::string::~string((string *)local_b8);
      std::__cxx11::string::~string((string *)local_d8);
    }
    Message::GetString((Message *)in_stack_fffffffffffffd58);
    DeathTest::set_last_death_test_message(&local_1d0);
    String::~String(in_stack_fffffffffffffd50);
    this_local._7_1_ = (bool)(buffer.ss_.ptr_._7_1_ & 1);
    Message::~Message((Message *)0x1331f4);
    String::~String(in_stack_fffffffffffffd50);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DeathTestImpl::Passed(bool status_ok) {
  if (!spawned())
    return false;

  const String error_message = GetCapturedStderr();

  bool success = false;
  Message buffer;

  buffer << "Death test: " << statement() << "\n";
  switch (outcome()) {
    case LIVED:
      buffer << "    Result: failed to die.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case THREW:
      buffer << "    Result: threw an exception.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case RETURNED:
      buffer << "    Result: illegal return in test statement.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case DIED:
      if (status_ok) {
        const bool matched = RE::PartialMatch(error_message.c_str(), *regex());
        if (matched) {
          success = true;
        } else {
          buffer << "    Result: died but not with expected error.\n"
                 << "  Expected: " << regex()->pattern() << "\n"
                 << "Actual msg:\n" << FormatDeathTestOutput(error_message);
        }
      } else {
        buffer << "    Result: died but not with expected exit code:\n"
               << "            " << ExitSummary(status()) << "\n"
               << "Actual msg:\n" << FormatDeathTestOutput(error_message);
      }
      break;
    case IN_PROGRESS:
    default:
      GTEST_LOG_(FATAL)
          << "DeathTest::Passed somehow called before conclusion of test";
  }

  DeathTest::set_last_death_test_message(buffer.GetString());
  return success;
}